

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::PathTypeHandlerBase::SetAllPropertiesToUndefined
          (PathTypeHandlerBase *this,DynamicObject *instance,bool invalidateFixedFields)

{
  ScriptContext *scriptContext;
  RecyclableObject *value;
  PropertyRecord *pPVar1;
  undefined7 in_register_00000011;
  uint uVar2;
  uint uVar3;
  PropertyIndex propertyIndex;
  
  uVar3 = (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1);
  if ((int)CONCAT71(in_register_00000011,invalidateFixedFields) != 0) {
    scriptContext =
         (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      pPVar1 = TypePath::GetPropertyIdUnchecked((this->typePath).ptr,uVar2);
      InvalidateFixedFieldAt(this,pPVar1->pid,(PropertyIndex)uVar2,scriptContext);
    }
  }
  value = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
          super_JavascriptLibraryBase).undefinedValue.ptr;
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    DynamicTypeHandler::SetSlotUnchecked(instance,uVar2,value);
  }
  return;
}

Assistant:

void PathTypeHandlerBase::SetAllPropertiesToUndefined(DynamicObject* instance, bool invalidateFixedFields)
    {
        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.
        int propertyCount = GetPathLength();

#if ENABLE_FIXED_FIELDS
        if (invalidateFixedFields)
        {
            Js::ScriptContext* scriptContext = instance->GetScriptContext();
            for (PropertyIndex propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
            {
                PropertyId propertyId = this->GetTypePath()->GetPropertyIdUnchecked(propertyIndex)->GetPropertyId();
                InvalidateFixedFieldAt(propertyId, propertyIndex, scriptContext);
            }
        }
#endif

        Js::RecyclableObject* undefined = instance->GetLibrary()->GetUndefined();
        for (PropertyIndex propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
        {
            SetSlotUnchecked(instance, propertyIndex, undefined);
        }

    }